

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_logger.cpp
# Opt level: O2

void __thiscall
duckdb::SQLLogicTestLogger::PrintResultError
          (SQLLogicTestLogger *this,MaterializedQueryResult *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *values,idx_t expected_column_count,bool row_wise)

{
  SQLLogicTestLogger *this_00;
  allocator local_61;
  string local_60;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,"Expected result:",&local_61);
  PrintHeader((string *)&stack0xffffffffffffffc0);
  this_00 = (SQLLogicTestLogger *)&stack0xffffffffffffffc0;
  std::__cxx11::string::~string((string *)this_00);
  PrintLineSep();
  PrintExpectedResult(this_00,values,expected_column_count,row_wise);
  PrintLineSep();
  std::__cxx11::string::string((string *)&local_60,"Actual result:",&local_61);
  PrintHeader(&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  PrintLineSep();
  duckdb::QueryResult::Print();
  return;
}

Assistant:

void SQLLogicTestLogger::PrintResultError(MaterializedQueryResult &result, const vector<string> &values,
                                          idx_t expected_column_count, bool row_wise) {
	PrintHeader("Expected result:");
	PrintLineSep();
	PrintExpectedResult(values, expected_column_count, row_wise);
	PrintLineSep();
	PrintHeader("Actual result:");
	PrintLineSep();
	result.Print();
}